

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,ListOfStatements *list_of_statements)

{
  pointer ppSVar1;
  bool bVar2;
  int iVar3;
  SubtreeWrapper *pSVar4;
  undefined4 extraout_var;
  SeqStatement *this_00;
  StatementWrapper *this_01;
  iterator __end3;
  long lVar5;
  long lVar6;
  iterator __begin3;
  pointer ppSVar7;
  SeqStatement *second;
  vector<IRT::Statement_*,_std::allocator<IRT::Statement_*>_> ir_statements;
  void *local_58;
  long lStack_50;
  long local_48;
  Statement *local_38;
  
  ppSVar7 = (list_of_statements->list_of_statements_).
            super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar1 = (list_of_statements->list_of_statements_).
            super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar7 == ppSVar1) {
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)0x0;
  }
  else if ((long)ppSVar1 - (long)ppSVar7 == 8) {
    pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,&(*ppSVar7)->super_Node)
    ;
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = pSVar4;
  }
  else {
    local_58 = (void *)0x0;
    lStack_50 = 0;
    local_48 = 0;
    do {
      pSVar4 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &(*ppSVar7)->super_Node);
      if (pSVar4 != (SubtreeWrapper *)0x0) {
        iVar3 = (*pSVar4->_vptr_SubtreeWrapper[3])(pSVar4);
        local_38 = (Statement *)CONCAT44(extraout_var,iVar3);
        std::vector<IRT::Statement*,std::allocator<IRT::Statement*>>::emplace_back<IRT::Statement*>
                  ((vector<IRT::Statement*,std::allocator<IRT::Statement*>> *)&local_58,&local_38);
      }
      ppSVar7 = ppSVar7 + 1;
    } while (ppSVar7 != ppSVar1);
    this_00 = *(SeqStatement **)(lStack_50 + -8);
    iVar3 = (int)((ulong)((long)(list_of_statements->list_of_statements_).
                                super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(list_of_statements->list_of_statements_).
                               super__Vector_base<Statement_*,_std::allocator<Statement_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3);
    if (1 < iVar3) {
      lVar5 = (ulong)(iVar3 - 2) + 1;
      second = this_00;
      do {
        this_00 = (SeqStatement *)operator_new(0x18);
        IRT::SeqStatement::SeqStatement
                  (this_00,*(Statement **)((long)local_58 + lVar5 * 8 + -8),&second->super_Statement
                  );
        lVar6 = lVar5 + -1;
        bVar2 = 0 < lVar5;
        lVar5 = lVar6;
        second = this_00;
      } while (lVar6 != 0 && bVar2);
    }
    this_01 = (StatementWrapper *)operator_new(0x10);
    IRT::StatementWrapper::StatementWrapper(this_01,&this_00->super_Statement);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_01;
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(ListOfStatements* list_of_statements) {
  auto& statements = list_of_statements->list_of_statements_;
  if (statements.empty()) {
    tos_value_ = nullptr;
  } else if (statements.size() == 1) {
    tos_value_ = Accept(statements[0]);
  } else {
    std::vector<IRT::Statement*> ir_statements;
    for (auto&& statement : statements) {
      auto ir_statement = Accept(statement);
      if (ir_statement) {
        ir_statements.emplace_back(ir_statement->ToStatement());
      }
    }

    IRT::Statement* suffix = ir_statements.back();
    for (int i = static_cast<int>(statements.size()) - 2; i >= 0; --i) {
      suffix = new IRT::SeqStatement(ir_statements[i], suffix);
    }

    tos_value_ = new IRT::StatementWrapper(suffix);
  }
}